

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

JSONNode __thiscall JSONWorker::parse_unformatted(JSONWorker *this,json_string *json)

{
  byte *json_00;
  invalid_argument *this_00;
  string *psVar1;
  
  json_00 = (byte *)(json->_M_dataplus)._M_p;
  if ((*json_00 | 0x20) == 0x7b) {
    _parse_unformatted(this,(char *)json_00,(char *)(json_00 + json->_M_string_length));
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  psVar1 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::invalid_argument::invalid_argument(this_00,(string *)psVar1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

json_throws(std::invalid_argument) {
    #if defined JSON_DEBUG || defined JSON_SAFE
	   #ifndef JSON_NO_EXCEPTIONS
		  JSON_ASSERT_SAFE((json[0] == JSON_TEXT('{')) || (json[0] == JSON_TEXT('[')), JSON_TEXT("Not JSON!"), throw std::invalid_argument(json_global(EMPTY_STD_STRING)););
	   #else
		  JSON_ASSERT_SAFE((json[0] == JSON_TEXT('{')) || (json[0] == JSON_TEXT('[')), JSON_TEXT("Not JSON!"), return JSONNode(JSON_NULL););
	   #endif
    #endif
	return _parse_unformatted(json.data(), json.data() + json.length());
}